

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_boost::random::detail::M3<-25>,_boost::random::detail::M3<27>,_boost::random::detail::M2<9>,_boost::random::detail::M3<1>,_boost::random::detail::M1,_boost::random::detail::M3<-9>,_boost::random::detail::M3<-21>,_boost::random::detail::M3<21>,_boost::random::detail::no_tempering>,_3006934229U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_boost::random::detail::M3<_25>,_boost::random::detail::M3<27>,_boost::random::detail::M2<9>,_boost::random::detail::M3<1>,_boost::random::detail::M1,_boost::random::detail::M3<_9>,_boost::random::detail::M3<_21>,_boost::random::detail::M3<21>,_boost::random::detail::no_tempering>,_3006934229U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  uint *p;
  uint state [624];
  uint *local_9e0;
  uint local_9d8 [2];
  undefined8 auStack_9d0 [311];
  uint local_18 [2];
  
  lVar2 = 0;
  do {
    *(undefined8 *)((long)auStack_9d0 + lVar2 * 4 + -8) = 0x100000001;
    *(undefined8 *)((long)auStack_9d0 + lVar2 * 4) = 0x100000001;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x270);
  local_9e0 = local_9d8;
  boost::random::
  well_engine<unsigned_int,32ul,624ul,31ul,70ul,179ul,449ul,boost::random::detail::M3<-25>,boost::random::detail::M3<27>,boost::random::detail::M2<9>,boost::random::detail::M3<1>,boost::random::detail::M1,boost::random::detail::M3<-9>,boost::random::detail::M3<-21>,boost::random::detail::M3<21>,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,624ul,31ul,70ul,179ul,449ul,boost::random::detail::M3<_25>,boost::random::detail::M3<27>,boost::random::detail::M2<9>,boost::random::detail::M3<1>,boost::random::detail::M1,boost::random::detail::M3<_9>,boost::random::detail::M3<_21>,boost::random::detail::M3<21>,boost::random::detail::no_tempering>
              *)this,&local_9e0,local_18);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = boost::random::
            well_engine<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_boost::random::detail::M3<-25>,_boost::random::detail::M3<27>,_boost::random::detail::M2<9>,_boost::random::detail::M3<1>,_boost::random::detail::M1,_boost::random::detail::M3<-9>,_boost::random::detail::M3<-21>,_boost::random::detail::M3<21>,_boost::random::detail::no_tempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }